

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

CURLcode set_local_ip(Curl_cfilter *cf,Curl_easy *data)

{
  uint uVar1;
  void *pvVar2;
  _Bool _Var3;
  int iVar4;
  uint *puVar5;
  char *pcVar6;
  int *piVar7;
  socklen_t local_1ac;
  int error;
  curl_socklen_t slen;
  Curl_sockaddr_storage ssloc;
  char buffer [256];
  cf_socket_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar2 = cf->ctx;
  if ((data->conn->handler->protocol & 0x800) == 0) {
    local_1ac = 0x80;
    memset(&error,0,0x80);
    iVar4 = getsockname(*(int *)((long)pvVar2 + 0x98),(sockaddr *)&error,&local_1ac);
    if (iVar4 != 0) {
      puVar5 = (uint *)__errno_location();
      uVar1 = *puVar5;
      pcVar6 = Curl_strerror(uVar1,(char *)&ssloc.buffer.sa_stor.__ss_align,0x100);
      Curl_failf(data,"getsockname() failed with errno %d: %s",(ulong)uVar1,pcVar6);
      return CURLE_FAILED_INIT;
    }
    _Var3 = Curl_addr2string((sockaddr *)&error,local_1ac,(char *)((long)pvVar2 + 0x114),
                             (int *)((long)pvVar2 + 0x144));
    if (!_Var3) {
      puVar5 = (uint *)__errno_location();
      uVar1 = *puVar5;
      piVar7 = __errno_location();
      pcVar6 = Curl_strerror(*piVar7,(char *)&ssloc.buffer.sa_stor.__ss_align,0x100);
      Curl_failf(data,"ssloc inet_ntop() failed with errno %d: %s",(ulong)uVar1,pcVar6);
      return CURLE_FAILED_INIT;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode set_local_ip(struct Curl_cfilter *cf,
                             struct Curl_easy *data)
{
  struct cf_socket_ctx *ctx = cf->ctx;

#ifdef HAVE_GETSOCKNAME
  if(!(data->conn->handler->protocol & CURLPROTO_TFTP)) {
    /* TFTP does not connect, so it cannot get the IP like this */

    char buffer[STRERROR_LEN];
    struct Curl_sockaddr_storage ssloc;
    curl_socklen_t slen = sizeof(struct Curl_sockaddr_storage);

    memset(&ssloc, 0, sizeof(ssloc));
    if(getsockname(ctx->sock, (struct sockaddr*) &ssloc, &slen)) {
      int error = SOCKERRNO;
      failf(data, "getsockname() failed with errno %d: %s",
            error, Curl_strerror(error, buffer, sizeof(buffer)));
      return CURLE_FAILED_INIT;
    }
    if(!Curl_addr2string((struct sockaddr*)&ssloc, slen,
                         ctx->l_ip, &ctx->l_port)) {
      failf(data, "ssloc inet_ntop() failed with errno %d: %s",
            errno, Curl_strerror(errno, buffer, sizeof(buffer)));
      return CURLE_FAILED_INIT;
    }
  }
#else
  (void)data;
  ctx->l_ip[0] = 0;
  ctx->l_port = -1;
#endif
  return CURLE_OK;
}